

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glob.cpp
# Opt level: O2

bool slang::matches(string_view str,string_view pattern)

{
  char cVar1;
  bool bVar2;
  size_t sVar3;
  bool bVar4;
  char *pcVar5;
  size_type __pos;
  basic_string_view<char,_std::char_traits<char>_> str_00;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  
  local_38._M_str = (char *)local_38._M_len;
  local_38._M_len = pattern._M_len;
  local_48 = str;
  while( true ) {
    pcVar5 = pattern._M_str;
    if (pattern._M_len == 0) {
      return local_48._M_len == 0;
    }
    cVar1 = *pcVar5;
    local_38._M_str = pcVar5;
    if (cVar1 == '*') break;
    if ((local_48._M_len == 0) || ((cVar1 != '?' && (*local_48._M_str != cVar1)))) {
      return false;
    }
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&local_48,1,0xffffffffffffffff);
    pattern = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_38,1,0xffffffffffffffff);
    local_38._M_len = pattern._M_len;
  }
  local_38 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_38,1,0xffffffffffffffff);
  if (local_38._M_len == 0) {
    return true;
  }
  sVar3 = local_48._M_len;
  __pos = 0;
  do {
    bVar2 = sVar3 != __pos;
    if (sVar3 == __pos) {
      return bVar2;
    }
    str_00 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_48,__pos,0xffffffffffffffff);
    bVar4 = matches(str_00,local_38);
    __pos = __pos + 1;
  } while (!bVar4);
  return bVar2;
}

Assistant:

static bool matches(std::string_view str, std::string_view pattern) {
    while (true) {
        // Empty pattern matches empty string.
        if (pattern.empty())
            return str.empty();

        // If next pattern char is '*' try to match pattern[1..] against
        // all possible tail strings of str to see if at least one succeeds.
        if (pattern[0] == '*') {
            // Simple case: if pattern is just '*' it matches anything.
            pattern = pattern.substr(1);
            if (pattern.empty())
                return true;

            for (size_t i = 0, end = str.size(); i < end; i++) {
                if (matches(str.substr(i), pattern))
                    return true;
            }
            return false;
        }

        // If pattern char isn't '*' then it must consume one character.
        if (str.empty())
            return false;

        // '?' matches any character, otherwise we need exact match.
        if (str[0] != pattern[0] && pattern[0] != '?')
            return false;

        str = str.substr(1);
        pattern = pattern.substr(1);
    }
}